

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O1

void tc_ap_str_trim_tail_from_set(CuTest *tc)

{
  char *pcVar1;
  char buf_str [1024];
  undefined8 local_438;
  undefined4 uStack_430;
  undefined1 uStack_42c;
  undefined1 uStack_42b;
  undefined1 uStack_42a;
  undefined1 uStack_429;
  undefined5 uStack_428;
  undefined1 uStack_423;
  undefined1 uStack_422;
  char acStack_421 [1009];
  
  pcVar1 = ap_str_trim_tail_from_set((char *)0x0," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x6c,"strings should be equal",(char *)0x0,pcVar1);
  pcVar1 = ap_str_trim_tail_from_set(""," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x6d,"strings should be equal","",pcVar1);
  local_438._0_2_ = 0x20;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x70,"strings should be equal","",pcVar1);
  local_438._2_6_ = local_438._2_6_ & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x2020);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x73,"strings should be equal","",pcVar1);
  local_438 = CONCAT44(local_438._4_4_,0x202020);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x76,"strings should be equal","",pcVar1);
  local_438._0_2_ = 9;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x79,"strings should be equal","",pcVar1);
  local_438._2_6_ = local_438._2_6_ & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x909);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x7c,"strings should be equal","",pcVar1);
  local_438 = CONCAT44(local_438._4_4_,0x90909);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x7f,"strings should be equal","",pcVar1);
  local_438._2_6_ = (uint6)((ulong)local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x6120);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x82,"strings should be equal"," a",pcVar1);
  local_438._0_4_ = 0x612020;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x85,"strings should be equal","  a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x61202020);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x88,"strings should be equal","   a",pcVar1);
  local_438._2_6_ = (uint6)((ulong)local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x6109);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x8b,"strings should be equal","\ta",pcVar1);
  local_438._0_4_ = 0x610909;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x8e,"strings should be equal","\t\ta",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438._0_4_ = 0x61090909;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x91,"strings should be equal","\t\t\ta",pcVar1);
  local_438 = CONCAT44(local_438._4_4_,0x206120);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x94,"strings should be equal"," a",pcVar1);
  local_438._2_6_ = (uint6)((ulong)local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x2061);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x97,"strings should be equal","a",pcVar1);
  local_438._0_4_ = 0x202061;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x9a,"strings should be equal","a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x20202061);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x9d,"strings should be equal","a",pcVar1);
  local_438._2_6_ = (uint6)((ulong)local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x961);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa0,"strings should be equal","a",pcVar1);
  local_438._0_4_ = 0x90961;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa3,"strings should be equal","a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438._0_4_ = 0x9090961;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa6,"strings should be equal","a",pcVar1);
  local_438._0_4_ = 0x96120;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa9,"strings should be equal"," a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x9206120);
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xac,"strings should be equal"," a",pcVar1);
  local_438._0_1_ = ' ';
  local_438._1_1_ = '\t';
  local_438._2_1_ = ' ';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = '\t';
  local_438._6_1_ = 'a';
  local_438._7_1_ = ' ';
  uStack_430 = 0x20092009;
  uStack_42c = 9;
  uStack_42b = 0x20;
  uStack_42a = 9;
  uStack_429 = 0;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xaf,"strings should be equal"," \t \t \ta",pcVar1);
  local_438 = 0x2062626220616161;
  uStack_430 = 0x636363;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb2,"strings should be equal","aaa bbb ccc",pcVar1);
  uStack_428 = 0x63636320;
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = ' ';
  local_438._3_1_ = ' ';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = ' ';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61616120;
  uStack_42c = 0x20;
  uStack_42b = 0x62;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb5,"strings should be equal","         aaa bbb ccc",pcVar1);
  uStack_428 = 0x6363632062;
  uStack_423 = 0;
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = '\t';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = '\t';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61610920;
  uStack_42c = 0x61;
  uStack_42b = 0x20;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb8,"strings should be equal","  \t\t  \t  \taaa bbb ccc",pcVar1);
  uStack_428 = 0x6363632062;
  uStack_423 = 0x20;
  uStack_422 = 9;
  builtin_strncpy(acStack_421," \t \t   ",8);
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = '\t';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = '\t';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61610920;
  uStack_42c = 0x61;
  uStack_42b = 0x20;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_tail_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xbb,"strings should be equal","  \t\t  \t  \taaa bbb ccc",pcVar1);
  return;
}

Assistant:

static void tc_ap_str_trim_tail_from_set (CuTest* tc)
{
	char	buf_str[1024];

	CuAssertStrEquals_Msg (tc, "strings should be equal", NULL,							ap_str_trim_tail_from_set (NULL, " \t"));
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set ("", " \t"));

	strcpy (buf_str, " ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  a",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "   a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "   a",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\ta",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\t\ta",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\t\t\ta",					ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " \t \t \ta \t \t \t \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " \t \t \ta",					ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "         aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "         aaa bbb ccc",		ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  \t\t  \t  \taaa bbb ccc",	ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc \t \t \t   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  \t\t  \t  \taaa bbb ccc",	ap_str_trim_tail_from_set (buf_str, " \t"));
}